

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  
  this->exponent_ = other->exponent_;
  iVar3 = other->used_digits_;
  if (0 < iVar3) {
    puVar1 = (other->bigits_).start_;
    puVar2 = (this->bigits_).start_;
    lVar4 = 0;
    do {
      puVar2[lVar4] = puVar1[lVar4];
      lVar4 = lVar4 + 1;
      iVar3 = other->used_digits_;
    } while (lVar4 < iVar3);
  }
  if (iVar3 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar4 = (long)iVar3;
    do {
      puVar1[lVar4] = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->used_digits_);
  }
  this->used_digits_ = other->used_digits_;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}